

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O0

void __thiscall Index::Index(Index *this,Index *param_2)

{
  long in_RSI;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_RDI;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *in_stack_00000018;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *in_stack_00000020;
  
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::set(in_RDI,in_RDI);
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::vector
            (in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::string
            ((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (string *)(in_RSI + 0x48));
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}